

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_time.cpp
# Opt level: O3

sc_time sc_core::sc_get_default_time_unit(void)

{
  sc_simcontext *this;
  sc_time *in_RDI;
  
  if (sc_get_default_time_unit()::warn_get_default_time_unit == '\0') {
    sc_get_default_time_unit()::warn_get_default_time_unit = '\x01';
    sc_report_handler::report
              (SC_INFO,"/IEEE_Std_1666/deprecated","deprecated function: sc_get_default_time_unit",
               "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/kernel/sc_time.cpp"
               ,0x1ee);
  }
  if (sc_curr_simcontext == (sc_simcontext *)0x0) {
    this = (sc_simcontext *)operator_new(0x168);
    sc_simcontext::sc_simcontext(this);
    sc_curr_simcontext = this;
    sc_default_global_context = this;
  }
  sc_time::from_value(in_RDI,sc_curr_simcontext->m_time_params->default_time_unit);
  return (sc_time)(value_type)in_RDI;
}

Assistant:

sc_time
sc_get_default_time_unit()
{
    static bool warn_get_default_time_unit = true;
    if ( warn_get_default_time_unit )
    {
        warn_get_default_time_unit=false;
        SC_REPORT_INFO(SC_ID_IEEE_1666_DEPRECATION_,
            "deprecated function: sc_get_default_time_unit");
    }
    return sc_time::from_value(
              sc_get_curr_simcontext()->m_time_params->default_time_unit
           );
}